

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool despot::option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  bool bVar6;
  Descriptor *local_e8;
  _func_int **local_d8;
  byte local_c9;
  _func_int **local_c8;
  byte local_bd;
  byte local_bc;
  byte local_bb;
  bool local_ba;
  undefined1 local_a0 [8];
  Option option;
  Descriptor *descriptor;
  int i2;
  int i1;
  char *optarg;
  int idx;
  bool have_more_args;
  bool try_single_minus_longopt;
  char *longopt_name;
  _func_int **pp_Stack_40;
  bool handle_short_options;
  char *param;
  int nonops;
  bool print_errors_local;
  bool single_minus_longopt_local;
  Action *action_local;
  char **args_local;
  int numargs_local;
  Descriptor *usage_local;
  bool gnu_local;
  
  args_local._4_4_ = numargs;
  if (args == (char **)0x0) {
    args_local._4_4_ = 0;
  }
  param._0_4_ = 0;
  action_local = (Action *)args;
  while( true ) {
    while( true ) {
      bVar6 = false;
      if (args_local._4_4_ != 0) {
        bVar6 = action_local->_vptr_Action != (_func_int **)0x0;
      }
      if (!bVar6) goto LAB_00217fa4;
      pp_Stack_40 = action_local->_vptr_Action;
      if ((*(char *)pp_Stack_40 == '-') && (*(char *)((long)pp_Stack_40 + 1) != '\0')) break;
      if (!gnu) goto LAB_00217fa4;
      param._0_4_ = (int)param + 1;
      action_local = action_local + 1;
      if (0 < (int)args_local._4_4_) {
        args_local._4_4_ = args_local._4_4_ - 1;
      }
    }
    if ((*(char *)((long)pp_Stack_40 + 1) == '-') && (*(char *)((long)pp_Stack_40 + 2) == '\0'))
    break;
    bVar6 = *(char *)((long)pp_Stack_40 + 1) != '-';
    if (bVar6) {
      _idx = (char *)((long)pp_Stack_40 + 1);
    }
    else {
      _idx = (char *)((long)pp_Stack_40 + 2);
    }
    local_ba = 1 < args_local._4_4_;
    optarg._7_1_ = single_minus_longopt;
    do {
      if ((!bVar6) || ((optarg._7_1_ & 1) != 0)) {
        optarg._0_4_ = 0;
        while( true ) {
          local_bb = 0;
          if (usage[(int)optarg].longopt != (char *)0x0) {
            bVar1 = streq(usage[(int)optarg].longopt,_idx);
            local_bb = bVar1 ^ 0xff;
          }
          if ((local_bb & 1) == 0) break;
          optarg._0_4_ = (int)optarg + 1;
        }
        if ((usage[(int)optarg].longopt == (char *)0x0) && (0 < min_abbr_len)) {
          descriptor._4_4_ = 0;
          while( true ) {
            local_bc = 0;
            if (usage[descriptor._4_4_].longopt != (char *)0x0) {
              bVar1 = streqabbr(usage[descriptor._4_4_].longopt,_idx,(long)min_abbr_len);
              local_bc = bVar1 ^ 0xff;
            }
            if ((local_bc & 1) == 0) break;
            descriptor._4_4_ = descriptor._4_4_ + 1;
          }
          descriptor._0_4_ = descriptor._4_4_;
          if (usage[descriptor._4_4_].longopt != (char *)0x0) {
            do {
              descriptor._0_4_ = (int)descriptor + 1;
              local_bd = 0;
              if (usage[(int)descriptor].longopt != (char *)0x0) {
                bVar1 = streqabbr(usage[(int)descriptor].longopt,_idx,(long)min_abbr_len);
                local_bd = bVar1 ^ 0xff;
              }
            } while ((local_bd & 1) != 0);
            if (usage[(int)descriptor].longopt == (char *)0x0) {
              optarg._0_4_ = descriptor._4_4_;
            }
          }
        }
        if (usage[(int)optarg].longopt != (char *)0x0) {
          bVar6 = false;
        }
        optarg._7_1_ = 0;
        _i2 = (_func_int **)_idx;
        while( true ) {
          bVar1 = false;
          if (*(char *)_i2 != '\0') {
            bVar1 = *(char *)_i2 != '=';
          }
          if (!bVar1) break;
          _i2 = (_func_int **)((long)_i2 + 1);
        }
        if (*(char *)_i2 == '=') {
          _i2 = (_func_int **)((long)_i2 + 1);
        }
        else {
          if (local_ba) {
            local_c8 = action_local[1]._vptr_Action;
          }
          else {
            local_c8 = (_func_int **)0x0;
          }
          _i2 = local_c8;
        }
      }
      if (bVar6) {
        pp_Var5 = (_func_int **)((long)pp_Stack_40 + 1);
        if (*(char *)((long)pp_Stack_40 + 1) == '\0') break;
        optarg._0_4_ = 0;
        while( true ) {
          local_c9 = 0;
          if (usage[(int)optarg].shortopt != (char *)0x0) {
            bVar1 = instr(*(char *)pp_Var5,usage[(int)optarg].shortopt);
            local_c9 = bVar1 ^ 0xff;
          }
          if ((local_c9 & 1) == 0) break;
          optarg._0_4_ = (int)optarg + 1;
        }
        if (*(char *)((long)pp_Stack_40 + 2) == '\0') {
          if (local_ba) {
            local_d8 = action_local[1]._vptr_Action;
          }
          else {
            local_d8 = (_func_int **)0x0;
          }
          _i2 = local_d8;
          pp_Stack_40 = pp_Var5;
        }
        else {
          _i2 = (_func_int **)((long)pp_Stack_40 + 2);
          pp_Stack_40 = pp_Var5;
        }
      }
      option._40_8_ = usage + (int)optarg;
      if (((Descriptor *)option._40_8_)->shortopt == (char *)0x0) {
        optarg._0_4_ = 0;
        while( true ) {
          bVar1 = false;
          if ((usage[(int)optarg].shortopt != (char *)0x0) &&
             (bVar1 = true, *usage[(int)optarg].shortopt == '\0')) {
            bVar1 = *usage[(int)optarg].longopt != '\0';
          }
          if (!bVar1) break;
          optarg._0_4_ = (int)optarg + 1;
        }
        if (usage[(int)optarg].shortopt == (char *)0x0) {
          local_e8 = (Descriptor *)0x0;
        }
        else {
          local_e8 = usage + (int)optarg;
        }
        option._40_8_ = local_e8;
      }
      if (option._40_8_ != 0) {
        Option::Option((Option *)local_a0,(Descriptor *)option._40_8_,(char *)pp_Stack_40,
                       (char *)_i2);
        uVar2 = (**(code **)(option._40_8_ + 0x18))((Option *)local_a0,print_errors);
        switch(uVar2) {
        case 0:
        case 2:
          option.name = (char *)0x0;
          break;
        case 1:
          if (((_i2 != (_func_int **)0x0) && (local_ba)) && (_i2 == action_local[1]._vptr_Action)) {
            shift((char **)action_local,(int)param);
            if (0 < (int)args_local._4_4_) {
              args_local._4_4_ = args_local._4_4_ - 1;
            }
            action_local = action_local + 1;
          }
          bVar6 = false;
          break;
        case 3:
          return false;
        }
        uVar3 = (*action->_vptr_Action[2])(action,local_a0);
        if ((uVar3 & 1) == 0) {
          return false;
        }
      }
    } while (bVar6);
    shift((char **)action_local,(int)param);
    action_local = action_local + 1;
    if (0 < (int)args_local._4_4_) {
      args_local._4_4_ = args_local._4_4_ - 1;
    }
  }
  shift((char **)action_local,(int)param);
  action_local = action_local + 1;
  if (0 < (int)args_local._4_4_) {
    args_local._4_4_ = args_local._4_4_ - 1;
  }
LAB_00217fa4:
  if ((0 < (int)args_local._4_4_) && (action_local->_vptr_Action == (_func_int **)0x0)) {
    args_local._4_4_ = 0;
  }
  if ((int)args_local._4_4_ < 0) {
    args_local._4_4_ = 0;
    while (action_local[(int)args_local._4_4_]._vptr_Action != (_func_int **)0x0) {
      args_local._4_4_ = args_local._4_4_ + 1;
    }
  }
  iVar4 = (*action->_vptr_Action[3])
                    (action,(ulong)(args_local._4_4_ + (int)param),action_local + -(long)(int)param)
  ;
  return (bool)((byte)iVar4 & 1);
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs,
	const char** args, Action& action, bool single_minus_longopt,
	bool print_errors, int min_abbr_len) {
	// protect against NULL pointer
	if (args == 0)
		numargs = 0;

	int nonops = 0;

	while (numargs != 0 && *args != 0) {
		const char* param = *args; // param can be --long-option, -srto or non-option argument

		// in POSIX mode the first non-option argument terminates the option list
		// a lone minus character is a non-option argument
		if (param[0] != '-' || param[1] == 0) {
			if (gnu) {
				++nonops;
				++args;
				if (numargs > 0)
					--numargs;
				continue;
			} else
				break;
		}

		// -- terminates the option list. The -- itself is skipped.
		if (param[1] == '-' && param[2] == 0) {
			shift(args, nonops);
			++args;
			if (numargs > 0)
				--numargs;
			break;
		}

		bool handle_short_options;
		const char* longopt_name;
		if (param[1] == '-') // if --long-option
			{
			handle_short_options = false;
			longopt_name = param + 2;
		} else {
			handle_short_options = true;
			longopt_name = param + 1; //for testing a potential -long-option
		}

		bool try_single_minus_longopt = single_minus_longopt;
		bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

		do // loop over short options in group, for long options the body is executed only once
		{
			int idx;

			const char* optarg;

			/******************** long option **********************/
			if (handle_short_options == false || try_single_minus_longopt) {
				idx = 0;
				while (usage[idx].longopt != 0
					&& !streq(usage[idx].longopt, longopt_name))
					++idx;

				if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
					{
					int i1 = 0;
					while (usage[i1].longopt != 0
						&& !streqabbr(usage[i1].longopt, longopt_name,
							min_abbr_len))
						++i1;
					if (usage[i1].longopt != 0) { // now test if the match is unambiguous by checking for another match
						int i2 = i1 + 1;
						while (usage[i2].longopt != 0
							&& !streqabbr(usage[i2].longopt, longopt_name,
								min_abbr_len))
							++i2;

						if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
							idx = i1;
					}
				}

				// if we found something, disable handle_short_options (only relevant if single_minus_longopt)
				if (usage[idx].longopt != 0)
					handle_short_options = false;

				try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

				optarg = longopt_name;
				while (*optarg != 0 && *optarg != '=')
					++optarg;
				if (*optarg == '=') // attached argument
					++optarg;
				else
					// possibly detached argument
					optarg = (have_more_args ? args[1] : 0);
			}

			/************************ short option ***********************************/
			if (handle_short_options) {
				if (*++param == 0) // point at the 1st/next option character
					break; // end of short option group

				idx = 0;
				while (usage[idx].shortopt != 0
					&& !instr(*param, usage[idx].shortopt))
					++idx;

				if (param[1] == 0) // if the potential argument is separate
					optarg = (have_more_args ? args[1] : 0);
				else
					// if the potential argument is attached
					optarg = param + 1;
			}

			const Descriptor* descriptor = &usage[idx];

			if (descriptor->shortopt == 0) /**************  unknown option ********************/
			{
				// look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
				idx = 0;
				while (usage[idx].shortopt != 0
					&& (usage[idx].shortopt[0] != 0
						|| usage[idx].longopt[0] != 0))
					++idx;
				descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
			}

			if (descriptor != 0) {
				Option option(descriptor, param, optarg);
				switch (descriptor->check_arg(option, print_errors)) {
				case ARG_ILLEGAL:
					return false; // fatal
				case ARG_OK:
					// skip one element of the argument vector, if it's a separated argument
					if (optarg != 0 && have_more_args && optarg == args[1]) {
						shift(args, nonops);
						if (numargs > 0)
							--numargs;
						++args;
					}

					// No further short options are possible after an argument
					handle_short_options = false;

					break;
				case ARG_IGNORE:
				case ARG_NONE:
					option.arg = 0;
					break;
				}

				if (!action.perform(option))
					return false;
			}

		} while (handle_short_options);

		shift(args, nonops);
		++args;
		if (numargs > 0)
			--numargs;

	} // while

	if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
		numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

	if (numargs < 0) // if we don't know the number of remaining non-option arguments
		{   // we need to count them
		numargs = 0;
		while (args[numargs] != 0)
			++numargs;
	}

	return action.finished(numargs + nonops, args - nonops);
}